

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_normalize_mxz(mbedtls_ecp_group *grp,mbedtls_ecp_point *P)

{
  mbedtls_mpi *X;
  int iVar1;
  
  X = &P->Z;
  iVar1 = mbedtls_mpi_inv_mod(X,X,&grp->P);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_mul_mpi(&P->X,&P->X,X);
    if (iVar1 == 0) {
      iVar1 = ecp_modp(&P->X,grp);
      if (iVar1 == 0) {
        mul_count = mul_count + 1;
        iVar1 = mbedtls_mpi_lset(X,1);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int ecp_normalize_mxz( const mbedtls_ecp_group *grp, mbedtls_ecp_point *P )
{
    int ret;

    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &P->Z, &P->Z, &grp->P ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &P->X, &P->X, &P->Z ) ); MOD_MUL( P->X );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &P->Z, 1 ) );

cleanup:
    return( ret );
}